

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode JsSetIndexedProperty(JsValueRef object,JsValueRef index,JsValueRef value)

{
  anon_class_24_3_97906013 fn;
  JsErrorCode JVar1;
  JsValueRef *in_stack_ffffffffffffffc0;
  JsValueRef local_20;
  JsValueRef value_local;
  JsValueRef index_local;
  JsValueRef object_local;
  
  fn.index = &local_20;
  fn.object = &value_local;
  fn.value = in_stack_ffffffffffffffc0;
  local_20 = value;
  value_local = index;
  index_local = object;
  JVar1 = ContextAPIWrapper<false,JsSetIndexedProperty::__0>(fn);
  return JVar1;
}

Assistant:

CHAKRA_API JsSetIndexedProperty(_In_ JsValueRef object, _In_ JsValueRef index, _In_ JsValueRef value)
{
    return ContextAPIWrapper<JSRT_MAYBE_TRUE>([&] (Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTSetIndex, object, index, value);

        VALIDATE_INCOMING_OBJECT(object, scriptContext);
        VALIDATE_INCOMING_REFERENCE(index, scriptContext);
        VALIDATE_INCOMING_REFERENCE(value, scriptContext);

        Js::JavascriptOperators::OP_SetElementI((Js::Var)object, (Js::Var)index, (Js::Var)value, scriptContext);

        return JsNoError;
    });
}